

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O3

SharedPtr<Filter> __thiscall
Rml::FilterBasicInstancer::InstanceFilter
          (FilterBasicInstancer *this,String *name,PropertyDictionary *properties)

{
  FilterBasic *pFVar1;
  Property *this_00;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  float fVar3;
  SharedPtr<Filter> SVar4;
  undefined1 local_39;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,name[3].field_2._M_local_buf[8]);
  if (this_00 == (Property *)0x0) {
    local_38._0_4_ = 0.0;
    local_38._4_4_ = 0;
    a_Stack_30[0]._M_pi._0_4_ = 0;
    a_Stack_30[0]._M_pi._4_4_ = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    local_38 = (FilterBasic *)((ulong)local_38._4_4_ << 0x20);
    Variant::GetInto<float,_0>(&this_00->value,(float *)&local_38);
    if (this_00->unit == DEG) {
      fVar3 = Math::DegreesToRadians((float)local_38);
    }
    else {
      fVar3 = (float)local_38;
      if (this_00->unit == PERCENT) {
        fVar3 = (float)local_38 * 0.01;
      }
    }
    local_38 = (FilterBasic *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Rml::FilterBasic,std::allocator<Rml::FilterBasic>>
              (a_Stack_30,(FilterBasic **)&local_38,(allocator<Rml::FilterBasic> *)&local_39);
    pFVar1 = local_38;
    ::std::__cxx11::string::_M_assign((string *)&local_38->name);
    pFVar1->value = fVar3;
    _Var2._M_pi = extraout_RDX_00;
  }
  *(float *)&(this->super_FilterInstancer)._vptr_FilterInstancer = (float)local_38;
  *(uint *)((long)&(this->super_FilterInstancer)._vptr_FilterInstancer + 4) = local_38._4_4_;
  *(undefined4 *)
   &(this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = a_Stack_30[0]._M_pi._0_4_;
  *(undefined4 *)
   ((long)&(this->super_FilterInstancer).super_EffectSpecification.properties.properties.
           super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
           ._M_impl.super__Vector_impl_data + 4) = a_Stack_30[0]._M_pi._4_4_;
  SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterBasicInstancer::InstanceFilter(const String& name, const PropertyDictionary& properties)
{
	const Property* p_value = properties.GetProperty(ids.value);
	if (!p_value)
		return nullptr;

	float value = p_value->Get<float>();
	if (p_value->unit == Unit::PERCENT)
		value *= 0.01f;
	else if (p_value->unit == Unit::DEG)
		value = Rml::Math::DegreesToRadians(value);

	auto filter = MakeShared<FilterBasic>();
	if (filter->Initialise(name, value))
		return filter;

	return nullptr;
}